

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_horiz_rs_sse4.c
# Opt level: O3

void av1_highbd_convolve_horiz_rs_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar6;
  uint uVar7;
  uint16_t *puVar8;
  uint uVar9;
  uint16_t *puVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (0 < w) {
    auVar13 = ZEXT416((uint)~(-1 << ((byte)bd & 0x1f)));
    auVar13 = pshuflw(auVar13,auVar13,0);
    uVar12 = 0;
    auVar14 = pmovsxbd(in_XMM1,0x40404040);
    do {
      if (0 < h) {
        uVar7 = x_step_qn * 2 + x0_qn;
        uVar9 = x_step_qn * 3 + x0_qn;
        auVar1 = *(undefined1 (*) [16])((long)x_filters + (ulong)((uint)x0_qn >> 4 & 0x3f0));
        auVar2 = *(undefined1 (*) [16])
                  ((long)x_filters + (ulong)((uint)(x_step_qn + x0_qn) >> 4 & 0x3f0));
        auVar3 = *(undefined1 (*) [16])((long)x_filters + (ulong)(uVar7 >> 4 & 0x3f0));
        auVar4 = *(undefined1 (*) [16])((long)x_filters + (ulong)(uVar9 >> 4 & 0x3f0));
        puVar8 = dst;
        puVar10 = src + -3;
        iVar11 = h;
        do {
          auVar16 = pmaddwd(*(undefined1 (*) [16])(puVar10 + (x0_qn >> 0xe)),auVar1);
          auVar20 = pmaddwd(*(undefined1 (*) [16])(puVar10 + (x_step_qn + x0_qn >> 0xe)),auVar2);
          auVar16 = phaddd(auVar16,auVar20);
          auVar20 = pmaddwd(*(undefined1 (*) [16])(puVar10 + ((int)uVar7 >> 0xe)),auVar3);
          auVar21 = pmaddwd(*(undefined1 (*) [16])(puVar10 + ((int)uVar9 >> 0xe)),auVar4);
          auVar20 = phaddd(auVar20,auVar21);
          auVar16 = phaddd(auVar16,auVar20);
          auVar20._0_4_ = auVar16._0_4_ + auVar14._0_4_ >> 7;
          auVar20._4_4_ = auVar16._4_4_ + auVar14._4_4_ >> 7;
          auVar20._8_4_ = auVar16._8_4_ + auVar14._8_4_ >> 7;
          auVar20._12_4_ = auVar16._12_4_ + auVar14._12_4_ >> 7;
          auVar16 = packusdw(auVar20,(undefined1  [16])0x0);
          sVar5 = auVar13._0_2_;
          sVar15 = auVar16._0_2_;
          sVar6 = auVar13._2_2_;
          sVar17 = auVar16._2_2_;
          sVar18 = auVar16._4_2_;
          sVar19 = auVar16._6_2_;
          *(ulong *)puVar8 =
               CONCAT26((ushort)(sVar6 < sVar19) * sVar6 | (ushort)(sVar6 >= sVar19) * sVar19,
                        CONCAT24((ushort)(sVar5 < sVar18) * sVar5 |
                                 (ushort)(sVar5 >= sVar18) * sVar18,
                                 CONCAT22((ushort)(sVar6 < sVar17) * sVar6 |
                                          (ushort)(sVar6 >= sVar17) * sVar17,
                                          (ushort)(sVar5 < sVar15) * sVar5 |
                                          (ushort)(sVar5 >= sVar15) * sVar15)));
          puVar10 = puVar10 + src_stride;
          puVar8 = puVar8 + dst_stride;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      uVar12 = uVar12 + 4;
      x0_qn = x0_qn + x_step_qn * 4;
      dst = dst + 4;
    } while (uVar12 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_convolve_horiz_rs_sse4_1(const uint16_t *src, int src_stride,
                                         uint16_t *dst, int dst_stride, int w,
                                         int h, const int16_t *x_filters,
                                         int x0_qn, int x_step_qn, int bd) {
  assert(UPSCALE_NORMATIVE_TAPS == 8);
  assert(bd == 8 || bd == 10 || bd == 12);

  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;

  const __m128i round_add = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();
  const __m128i clip_maximum = _mm_set1_epi16((1 << bd) - 1);

  const uint16_t *src_y;
  uint16_t *dst_y;
  int x_qn = x0_qn;
  for (int x = 0; x < w; x += 4, x_qn += 4 * x_step_qn) {
    const int x_filter_idx0 =
        ((x_qn + 0 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx1 =
        ((x_qn + 1 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx2 =
        ((x_qn + 2 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx3 =
        ((x_qn + 3 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;

    assert(x_filter_idx0 <= RS_SUBPEL_MASK);
    assert(x_filter_idx1 <= RS_SUBPEL_MASK);
    assert(x_filter_idx2 <= RS_SUBPEL_MASK);
    assert(x_filter_idx3 <= RS_SUBPEL_MASK);

    const int16_t *const x_filter0 =
        &x_filters[x_filter_idx0 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter1 =
        &x_filters[x_filter_idx1 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter2 =
        &x_filters[x_filter_idx2 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter3 =
        &x_filters[x_filter_idx3 * UPSCALE_NORMATIVE_TAPS];

    const __m128i fil0_16 = xx_loadu_128(x_filter0);
    const __m128i fil1_16 = xx_loadu_128(x_filter1);
    const __m128i fil2_16 = xx_loadu_128(x_filter2);
    const __m128i fil3_16 = xx_loadu_128(x_filter3);

    src_y = src;
    dst_y = dst;
    for (int y = 0; y < h; y++, src_y += src_stride, dst_y += dst_stride) {
      const uint16_t *const src_x0 =
          &src_y[(x_qn + 0 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint16_t *const src_x1 =
          &src_y[(x_qn + 1 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint16_t *const src_x2 =
          &src_y[(x_qn + 2 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint16_t *const src_x3 =
          &src_y[(x_qn + 3 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];

      // Load up the source data. This is 16-bit input data, so each load
      // gets 8 pixels.
      const __m128i src0_16 = xx_loadu_128(src_x0);
      const __m128i src1_16 = xx_loadu_128(src_x1);
      const __m128i src2_16 = xx_loadu_128(src_x2);
      const __m128i src3_16 = xx_loadu_128(src_x3);

      // Multiply by filter coefficients (results in a 32-bit value),
      // and add adjacent pairs, i.e.
      // ([ s7 s6 s5 s4 s3 s2 s1 s0], [ f7 f6 f5 f4 f3 f2 f1 f0 ])
      // -> [ {s7*f7+s6*f6} {s5*f5+s4*f4} {s3*f3+s2*f2} {s1*f1+s0*f0} ]
      const __m128i conv0_32 = _mm_madd_epi16(src0_16, fil0_16);
      const __m128i conv1_32 = _mm_madd_epi16(src1_16, fil1_16);
      const __m128i conv2_32 = _mm_madd_epi16(src2_16, fil2_16);
      const __m128i conv3_32 = _mm_madd_epi16(src3_16, fil3_16);

      // Reduce horizontally and add, i.e.
      // ([ D C B A ], [ S R Q P ]) -> [ S+R Q+P D+C B+A ]
      const __m128i conv01_32 = _mm_hadd_epi32(conv0_32, conv1_32);
      const __m128i conv23_32 = _mm_hadd_epi32(conv2_32, conv3_32);

      const __m128i conv0123_32 = _mm_hadd_epi32(conv01_32, conv23_32);

      // Divide down by (1 << FILTER_BITS), rounding to nearest.
      const __m128i shifted_32 =
          _mm_srai_epi32(_mm_add_epi32(conv0123_32, round_add), FILTER_BITS);

      // Pack 32-bit values into 16-bit values, i.e.
      // ([ D C B A ], [ 0 0 0 0 ]) -> [ 0 0 0 0 D C B A ]
      const __m128i shifted_16 = _mm_packus_epi32(shifted_32, zero);

      // Clip the values at (1 << bd) - 1
      const __m128i clipped_16 = _mm_min_epi16(shifted_16, clip_maximum);

      // Write to the output
      xx_storel_64(&dst_y[x], clipped_16);
    }
  }
}